

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

void IoTHubMessaging_LL_Destroy(IOTHUB_MESSAGING_HANDLE messagingHandle)

{
  IOTHUB_MESSAGING *messHandle;
  IOTHUB_MESSAGING_HANDLE messagingHandle_local;
  
  if (messagingHandle != (IOTHUB_MESSAGING_HANDLE)0x0) {
    dequeue_all_send_callback_data(messagingHandle,IOTHUB_MESSAGING_BECAUSE_DESTROY);
    singlylinkedlist_destroy(messagingHandle->send_callback_data);
    free(messagingHandle->hostname);
    free(messagingHandle->iothubName);
    free(messagingHandle->iothubSuffix);
    free(messagingHandle->sharedAccessKey);
    free(messagingHandle->keyName);
    free(messagingHandle->trusted_cert);
    free(messagingHandle);
  }
  return;
}

Assistant:

void IoTHubMessaging_LL_Destroy(IOTHUB_MESSAGING_HANDLE messagingHandle)
{
    if (messagingHandle != NULL)
    {
        IOTHUB_MESSAGING* messHandle = (IOTHUB_MESSAGING*)messagingHandle;

        dequeue_all_send_callback_data(messagingHandle, IOTHUB_MESSAGING_BECAUSE_DESTROY);
        
        singlylinkedlist_destroy(messagingHandle->send_callback_data);
        free(messHandle->hostname);
        free(messHandle->iothubName);
        free(messHandle->iothubSuffix);
        free(messHandle->sharedAccessKey);
        free(messHandle->keyName);
        free(messHandle->trusted_cert);
        free(messHandle);
    }
}